

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationResult.cpp
# Opt level: O0

void __thiscall SimulationResult::Load(SimulationResult *this,string *filename)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  undefined8 uVar4;
  istream *__x;
  size_type sVar5;
  string *in_RSI;
  long in_RDI;
  istringstream is;
  string buffer;
  stringstream ss;
  ifstream fp;
  double r;
  stringstream *in_stack_fffffffffffffa58;
  undefined7 in_stack_fffffffffffffa60;
  undefined1 in_stack_fffffffffffffa67;
  SimulationResult *in_stack_fffffffffffffa70;
  istringstream local_558 [384];
  string local_3d8 [32];
  stringstream local_3b8 [16];
  ostream local_3a8 [392];
  long local_220 [65];
  double local_18 [3];
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_220,pcVar2,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x8f3f8d);
    std::__cxx11::string::string(local_3d8);
    while( true ) {
      __x = std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)local_220,local_3d8);
      bVar1 = std::ios::eof();
      if (((bVar1 ^ 0xff) & 1) == 0) break;
      std::__cxx11::istringstream::istringstream(local_558,local_3d8,_S_in);
      std::istream::operator>>(local_558,local_18);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffa70,
                 (value_type_conflict3 *)__x);
      std::__cxx11::istringstream::~istringstream(local_558);
    }
    sVar5 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RDI + 8));
    *(int *)(in_RDI + 0x28) = (int)sVar5;
    UpdateStatistics(in_stack_fffffffffffffa70);
    std::__cxx11::string::~string(local_3d8);
    std::ifstream::~ifstream(local_220);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_3b8);
  poVar3 = std::operator<<(local_3a8,"SimulationResult::Load: failed to ");
  poVar3 = std::operator<<(poVar3,"open file ");
  std::operator<<(poVar3,in_RSI);
  uVar4 = __cxa_allocate_exception(0x28);
  E::E((E *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60),in_stack_fffffffffffffa58)
  ;
  __cxa_throw(uVar4,&E::typeinfo,E::~E);
}

Assistant:

void SimulationResult::Load(string filename)
{
    double r;

    ifstream fp(filename.c_str());
    if(!fp)
    {
        stringstream ss;
        ss << "SimulationResult::Load: failed to "
           << "open file " << filename;
        throw E(ss);
    }

    _m_rewards.clear();

    string buffer;
    while(!getline(fp,buffer).eof())
    {
        istringstream is(buffer);
        is >> r;
        _m_rewards.push_back(r);
    }

    _m_nr_stored=_m_rewards.size();
    UpdateStatistics();
}